

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeCommandListCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_list_desc_t *desc,
          ze_command_list_handle_t *phCommandList)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_94;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  uVar9 = *(ulong *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeCommandListCreate(hContext, hDevice, desc, phCommandList)","");
  if (*(char *)(uVar9 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(uVar9 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar6 + 0x218);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar6 + 0xd30);
    lVar6 = *(long *)(lVar6 + 0xd38);
    uVar8 = lVar6 - lVar3 >> 3;
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        zVar5 = (**(code **)(*plVar4 + 0x230))(plVar4,hContext,hDevice,desc,phCommandList);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListCreate",zVar5);
          uVar9 = (ulong)zVar5;
          break;
        }
        bVar10 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    local_94 = (ze_result_t)uVar9;
    if (bVar10) {
      return local_94;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZEHandleLifetimeValidation::zeCommandListCreatePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,desc,
                           phCommandList), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeCommandListCreate",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hContext,hDevice,desc,phCommandList);
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(lVar1 + 0xd30) + -8 + uVar9 * 8);
        result = (**(code **)(*plVar4 + 0x238))(plVar4,hContext,hDevice,desc,phCommandList,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeCommandListCreate",result);
          local_94 = result;
          break;
        }
        bVar10 = uVar9 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar6 != 0);
    }
    if (bVar10) {
      return local_94;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phCommandList != (ze_command_list_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phCommandList,true);
      HandleLifetimeValidation::addDependent
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hContext,*phCommandList);
    }
  }
  logAndPropagateResult("zeCommandListCreate",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_list_desc_t* desc,             ///< [in] pointer to command list descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        context.logger->log_trace("zeCommandListCreate(hContext, hDevice, desc, phCommandList)");

        auto pfnCreate = context.zeDdiTable.CommandList.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeCommandListCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeCommandListCreatePrologue( hContext, hDevice, desc, phCommandList );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }

        auto driver_result = pfnCreate( hContext, hDevice, desc, phCommandList );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeCommandListCreateEpilogue( hContext, hDevice, desc, phCommandList ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeCommandListCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phCommandList){
                context.handleLifetime->addHandle( *phCommandList );
                context.handleLifetime->addDependent( hContext, *phCommandList );

            }
        }
        return logAndPropagateResult("zeCommandListCreate", driver_result);
    }